

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O3

void __thiscall
VPLGrammar::Parser::UnaryOperatorNode::BuildProgram
          (UnaryOperatorNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = (**(code **)(*(long *)(((this->super_ASTNodeBasic).children_.
                                  super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                                ._M_t + 0x10))();
  if (iVar1 == 0x30) {
    pcVar2 = "    neg\n";
  }
  else if (iVar1 == 0x3c) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"    push -1\n",0xc);
    pcVar2 = "    xor\n";
  }
  else {
    if (iVar1 != 0x3b) {
      return;
    }
    pcVar2 = "    not\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,8);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                switch (children_[0]->GetType()) {
                    case kMinusType:
                        out << "    neg\n";
                        break;
                    case kNotType:
                        out << "    not\n";
                        break;
                    case kBitwiseNotType:
                        out << "    push -1\n";
                        out << "    xor\n";
                        break;
                }
            }